

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coolprop_tracer.h
# Opt level: O0

pair<double,_double> __thiscall
PyVLEIsolineTracer<double>::get_integration_limits(PyVLEIsolineTracer<double> *this)

{
  bool bVar1;
  enable_if_t<_cast_is_temporary_value_reference<pair<double,_double>_>::value,_std::pair<double,_double>_>
  eVar2;
  pair<double,_double> pVar3;
  double local_88;
  object local_70;
  object o;
  function overload;
  gil_scoped_acquire gil;
  undefined1 local_40 [8];
  gil_scoped_acquire acquire;
  gil_scoped_release release;
  PyVLEIsolineTracer<double> *this_local;
  double local_10;
  
  eVar2.second = local_10;
  eVar2.first = local_88;
  pybind11::gil_scoped_release::gil_scoped_release((gil_scoped_release *)&acquire.release,false);
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)local_40);
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&overload);
  pybind11::get_overload<VLEIsolineTracer<double>>
            ((pybind11 *)&o,&this->super_VLEIsolineTracer<double>,"get_integration_limits");
  bVar1 = pybind11::handle::operator_cast_to_bool(&o.super_handle);
  if (bVar1) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_70);
    eVar2 = pybind11::detail::cast_safe<std::pair<double,double>>(&local_70);
    this_local = (PyVLEIsolineTracer<double> *)eVar2.first;
    pybind11::object::~object(&local_70);
  }
  local_10 = eVar2.second;
  pVar3.second = local_10;
  pVar3.first = (double)this_local;
  pybind11::function::~function((function *)&o);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&overload);
  if (!bVar1) {
    pVar3 = AbstractIsolineTracer<double>::get_integration_limits
                      ((AbstractIsolineTracer<double> *)this);
  }
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)local_40);
  pybind11::gil_scoped_release::~gil_scoped_release((gil_scoped_release *)&acquire.release);
  return pVar3;
}

Assistant:

std::pair<TYPE, TYPE> get_integration_limits() override {
        // Release the GIL
        py::gil_scoped_release release;
        {
            // Acquire GIL before calling Python code
            py::gil_scoped_acquire acquire;

            // Parameters to macro are: Return type, parent class, name of function in C++, argument(s)
            typedef std::pair<TYPE, TYPE> pairdoubledouble;
            PYBIND11_OVERLOAD(pairdoubledouble, 
                              VLEIsolineTracer, 
                              get_integration_limits, 
                              // No arguments
                              );
        }
    }